

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

ArrayBuilder<kj::Exception::Detail> * __thiscall
kj::ArrayBuilder<kj::Exception::Detail>::operator=
          (ArrayBuilder<kj::Exception::Detail> *this,ArrayBuilder<kj::Exception::Detail> *other)

{
  Detail *pDVar1;
  RemoveConst<kj::Exception::Detail> *pRVar2;
  Detail *pDVar3;
  
  pDVar1 = this->ptr;
  if (pDVar1 != (Detail *)0x0) {
    pRVar2 = this->pos;
    pDVar3 = this->endPtr;
    this->ptr = (Detail *)0x0;
    this->pos = (RemoveConst<kj::Exception::Detail> *)0x0;
    this->endPtr = (Detail *)0x0;
    (**this->disposer->_vptr_ArrayDisposer)
              (this->disposer,pDVar1,0x20,(long)pRVar2 - (long)pDVar1 >> 5,
               (long)pDVar3 - (long)pDVar1 >> 5,
               ArrayDisposer::Dispose_<kj::Exception::Detail>::destruct);
  }
  this->ptr = other->ptr;
  this->pos = other->pos;
  this->endPtr = other->endPtr;
  this->disposer = other->disposer;
  other->ptr = (Detail *)0x0;
  other->pos = (RemoveConst<kj::Exception::Detail> *)0x0;
  other->endPtr = (Detail *)0x0;
  return this;
}

Assistant:

ArrayBuilder& operator=(ArrayBuilder&& other) {
    dispose();
    ptr = other.ptr;
    pos = other.pos;
    endPtr = other.endPtr;
    disposer = other.disposer;
    other.ptr = nullptr;
    other.pos = nullptr;
    other.endPtr = nullptr;
    return *this;
  }